

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

vec * cyclic_reduction(vec *__return_storage_ptr__,TridiagonalMatrix *m,vec *b)

{
  pointer *ppdVar1;
  double *pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  TridiagonalMatrix *pTVar7;
  vec *pvVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  double *pdVar12;
  int iVar13;
  long lVar14;
  ulong __n;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  allocator_type local_131;
  TridiagonalMatrix *local_130;
  vec *local_128;
  undefined8 local_120;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  a_vecs;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  rhs_vecs;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  c_vecs;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  b_vecs;
  vec new_rhs;
  vec new_c;
  vec new_b;
  vec new_a;
  
  a_vecs.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  a_vecs.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  a_vecs.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&a_vecs,&m->as);
  b_vecs.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  b_vecs.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  b_vecs.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&b_vecs,&m->bs);
  c_vecs.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  c_vecs.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  c_vecs.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_130 = m;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&c_vecs,&m->cs);
  rhs_vecs.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  rhs_vecs.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  rhs_vecs.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128 = __return_storage_ptr__;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&rhs_vecs,b);
  __n = (ulong)(uint)local_130->size;
  while( true ) {
    pTVar7 = local_130;
    if ((int)(uint)__n < 2) break;
    __n = (ulong)((uint)__n >> 1);
    new_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&new_a,__n,(value_type_conflict *)&new_b,(allocator_type *)&new_c);
    new_c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&new_b,__n,(value_type_conflict *)&new_c,(allocator_type *)&new_rhs);
    new_rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&new_c,__n,(value_type_conflict *)&new_rhs
               ,(allocator_type *)&local_120);
    local_120 = 0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&new_rhs,__n,
               (value_type_conflict *)&local_120,&local_131);
    for (lVar11 = 0; __n * 8 - lVar11 != 0; lVar11 = lVar11 + 8) {
      pdVar3 = a_vecs.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar4 = b_vecs.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar5 = c_vecs.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar2 = (double *)((long)pdVar5 + lVar11 * 2);
      pdVar12 = (double *)((long)pdVar4 + lVar11 * 2 + 8);
      auVar15._0_8_ = *pdVar12 * *pdVar2;
      auVar15._8_8_ = pdVar12[1] * pdVar2[1];
      auVar16._8_8_ = *(undefined8 *)((long)pdVar3 + lVar11 * 2 + 0x10);
      auVar16._0_8_ = *(undefined8 *)((long)pdVar3 + lVar11 * 2);
      auVar16 = divpd(auVar15,auVar16);
      *(double *)
       ((long)new_a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar11) =
           (*(double *)((long)pdVar3 + lVar11 * 2 + 8) - auVar16._0_8_) - auVar16._8_8_;
      *(double *)
       ((long)new_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar11) =
           (-*(double *)((long)pdVar4 + lVar11 * 2) * *(double *)((long)pdVar4 + lVar11 * 2 + 8)) /
           *(double *)((long)pdVar3 + lVar11 * 2);
      *(double *)
       ((long)new_c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar11) =
           (-*(double *)((long)pdVar5 + lVar11 * 2 + 8) *
           *(double *)((long)pdVar5 + lVar11 * 2 + 0x10)) /
           *(double *)((long)pdVar3 + lVar11 * 2 + 0x10);
      pdVar6 = rhs_vecs.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      *(double *)
       ((long)new_rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar11) =
           (*(double *)((long)pdVar6 + lVar11 * 2 + 8) -
           (*(double *)((long)pdVar6 + lVar11 * 2) * *(double *)((long)pdVar4 + lVar11 * 2 + 8)) /
           *(double *)((long)pdVar3 + lVar11 * 2)) -
           (*(double *)((long)pdVar6 + lVar11 * 2 + 0x10) *
           *(double *)((long)pdVar5 + lVar11 * 2 + 8)) /
           *(double *)((long)pdVar3 + lVar11 * 2 + 0x10);
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(&a_vecs,&new_a);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(&b_vecs,(value_type *)&new_b.super__Vector_base<double,_std::allocator<double>_>);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(&c_vecs,&new_c);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(&rhs_vecs,&new_rhs);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&new_rhs.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&new_c.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&new_b.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&new_a.super__Vector_base<double,_std::allocator<double>_>);
  }
  new_a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (local_128,(long)local_130->size + 2,(value_type_conflict *)&new_a,
             (allocator_type *)&new_b);
  pvVar8 = local_128;
  iVar10 = pTVar7->size / 2 + 1;
  local_130 = (TridiagonalMatrix *)
              a_vecs.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = ((long)a_vecs.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)a_vecs.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  while (iVar13 = (int)uVar9, uVar9 = (ulong)(iVar13 - 1), iVar13 != 0) {
    pdVar12 = (local_128->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar14 = (long)iVar10;
    for (lVar11 = 1; lVar11 <= (int)__n; lVar11 = lVar11 + 2) {
      pdVar12[lVar14] =
           ((rhs_vecs.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar9].
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar11 + -1] -
            b_vecs.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar9].
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar11 + -1] * *pdVar12) -
           c_vecs.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar9].
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar11 + -1] * pdVar12[lVar14 * 2]) /
           a_vecs.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar9].
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar11 + -1];
      pdVar12 = pdVar12 + lVar14 * 2;
    }
    __n = (ulong)((int)__n * 2 + 1);
    iVar10 = iVar10 / 2;
  }
  ppdVar1 = &(local_128->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  *ppdVar1 = *ppdVar1 + -1;
  std::vector<double,_std::allocator<double>_>::erase
            (local_128,
             (const_iterator)
             (local_128->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&rhs_vecs);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&c_vecs);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&b_vecs);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&a_vecs);
  return pvVar8;
}

Assistant:

vec cyclic_reduction(const TridiagonalMatrix& m, const vec& b)
{
	std::vector<vec > a_vecs;
	a_vecs.push_back(m.as);
	std::vector<vec > b_vecs;
	b_vecs.push_back(m.bs);
	std::vector<vec > c_vecs;
	c_vecs.push_back(m.cs);
	std::vector<vec > rhs_vecs;
	rhs_vecs.push_back(b);
	int equation_count = m.size;

	while (equation_count > 1)
	{
		equation_count /= 2;
		vec new_a(equation_count, 0.0);
		vec new_b(equation_count, 0.0);
		vec new_c(equation_count, 0.0);
		vec new_rhs(equation_count, 0.0);
		vec& old_a = a_vecs.back();
		vec& old_b = b_vecs.back();
		vec& old_c = c_vecs.back();
		vec& old_rhs = rhs_vecs.back();

		for (int i = 0; i < equation_count; i++)
		{
			int old_i = 2 * i + 1;
			new_a[i] = old_a[old_i] -
				old_b[old_i] * old_c[old_i - 1] / old_a[old_i - 1] -
				old_c[old_i] * old_b[old_i + 1] / old_a[old_i + 1];
			new_b[i] = -old_b[old_i - 1] * old_b[old_i] / old_a[old_i - 1];
			new_c[i] = -old_c[old_i] * old_c[old_i + 1] / old_a[old_i + 1];
			new_rhs[i] = old_rhs[old_i] -
				old_rhs[old_i - 1] * old_b[old_i] / old_a[old_i - 1] -
				old_rhs[old_i + 1] * old_c[old_i] / old_a[old_i + 1];
		}

		a_vecs.push_back(new_a);
		b_vecs.push_back(new_b);
		c_vecs.push_back(new_c);
		rhs_vecs.push_back(new_rhs);
	}

	// result is padded with one zero one both sides to emulate
	// implicit variables x_0 and x_N
	vec result(m.size + 2, 0.0);
	// factor maps indices of equations in full system extended with x_0=0
	// and x_N=0 onto indices of equations in reduced extended system
	int factor = m.size / 2 + 1;
	for (unsigned int i = a_vecs.size(); i-- > 0;)
	{
		vec& as = a_vecs[i];
		vec& bs = b_vecs[i];
		vec& cs = c_vecs[i];
		vec& rhs = rhs_vecs[i];

		// j is an index of an equation in the reduced system extended with
		// x_0=0 and x_N=0
		for (int j = 1; j < equation_count + 1; j += 2)
		{
			// index in coefficents arrays is less by 1 since they don't
			// include x_0=0 and x_N=0 equations
			int coeff_j = j - 1;
			// mapping j to the index in the full extended system
			int result_j = j * factor;
			int result_j_minus1 = result_j - factor;
			int result_j_plus1 = result_j + factor;

			result[result_j] =
				(rhs[coeff_j] - bs[coeff_j] * result[result_j_minus1] -
				cs[coeff_j] * result[result_j_plus1]) / as[coeff_j];
		}

		equation_count = equation_count * 2 + 1;
		factor /= 2;
	}

	// drop the padding
	result.pop_back();
	result.erase(result.begin());

	return result;
}